

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O1

void __thiscall mp::NLSolution::NLSolution(NLSolution *this,NLSolution *param_1)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = param_1->nbs_;
  this->solve_result_ = param_1->solve_result_;
  this->nbs_ = iVar2;
  (this->solve_message_)._M_dataplus._M_p = (pointer)&(this->solve_message_).field_2;
  pcVar1 = (param_1->solve_message_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->solve_message_,pcVar1,
             pcVar1 + (param_1->solve_message_)._M_string_length);
  this->obj_val_ = param_1->obj_val_;
  std::vector<double,_std::allocator<double>_>::vector(&this->x_,&param_1->x_);
  std::vector<double,_std::allocator<double>_>::vector(&this->y_,&param_1->y_);
  std::
  _Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
  ::_Rb_tree((_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
              *)&this->suffixes_,
             (_Rb_tree<mp::NLSuffix,_mp::NLSuffix,_std::_Identity<mp::NLSuffix>,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>
              *)&param_1->suffixes_);
  return;
}

Assistant:

operator bool() const { return solve_result_ > -2; }